

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

QBitArray *
performBitwiseOperationInCopy<std::bit_or<unsigned_char>>(QBitArray *self,QBitArray *other)

{
  QArrayData *data;
  char *pcVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QBitArray local_58;
  QBitArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d.d = (self->d).d.d;
  local_38.d.d.ptr = (self->d).d.ptr;
  (self->d).d.d = (Data *)0x0;
  (self->d).d.ptr = (char *)0x0;
  local_38.d.d.size = (self->d).d.size;
  (self->d).d.size = 0;
  sizedForOverwrite(&local_58,&local_38,other);
  data = &((self->d).d.d)->super_QArrayData;
  pcVar1 = (self->d).d.ptr;
  (self->d).d.d = local_58.d.d.d;
  (self->d).d.ptr = local_58.d.d.ptr;
  qVar2 = (self->d).d.size;
  (self->d).d.size = local_58.d.d.size;
  local_58.d.d.d = (Data *)data;
  local_58.d.d.ptr = pcVar1;
  local_58.d.d.size = qVar2;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  performBitwiseOperationHelper<std::bit_or<unsigned_char>>(self,&local_38,other);
  if (&(local_38.d.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return self;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationInCopy(QBitArray &self, const QBitArray &other, BitwiseOp op)
{
    QBitArray tmp(std::move(self));
    self = sizedForOverwrite(tmp, other);
    return performBitwiseOperationHelper(self, tmp, other, op);
}